

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<ProKey,ProFunctionDef>::emplace<ProFunctionDef_const&>
          (QHash<ProKey,_ProFunctionDef> *this,ProKey *key,ProFunctionDef *args)

{
  long lVar1;
  bool bVar2;
  QHash<ProKey,_ProFunctionDef> *in_RDX;
  ProFunctionDef *in_RSI;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  QHash<ProKey,_ProFunctionDef> copy;
  ProFunctionDef *in_stack_ffffffffffffff98;
  ProFunctionDef *in_stack_ffffffffffffffa0;
  ProFunctionDef *in_stack_ffffffffffffffa8;
  piter local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<ProKey,_ProFunctionDef>::isDetached
                    ((QHash<ProKey,_ProFunctionDef> *)in_stack_ffffffffffffffa0);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::shouldGrow
                      ((Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)
                       (in_RDI->super_ProString).m_string.d.d);
    if (bVar2) {
      ProFunctionDef::ProFunctionDef(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_30 = (piter)QHash<ProKey,_ProFunctionDef>::emplace_helper<ProFunctionDef>
                                  (in_RDX,in_RDI,in_RSI);
      ProFunctionDef::~ProFunctionDef(in_stack_ffffffffffffffa0);
    }
    else {
      local_30 = (piter)emplace_helper<ProFunctionDef_const&>
                                  (in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QHash<ProKey,_ProFunctionDef>::QHash
              ((QHash<ProKey,_ProFunctionDef> *)in_stack_ffffffffffffffa0,
               (QHash<ProKey,_ProFunctionDef> *)in_stack_ffffffffffffff98);
    QHash<ProKey,_ProFunctionDef>::detach
              ((QHash<ProKey,_ProFunctionDef> *)in_stack_ffffffffffffffa0);
    local_30 = (piter)emplace_helper<ProFunctionDef_const&>(in_RDX,in_RDI,in_stack_ffffffffffffffa8)
    ;
    QHash<ProKey,_ProFunctionDef>::~QHash
              ((QHash<ProKey,_ProFunctionDef> *)in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_30;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }